

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O1

void duckdb::Leaf::MergeInlined(ART *art,Node *l_node,Node *r_node)

{
  ulong uVar1;
  Allocator *allocator;
  ulong *data;
  ARTKey local_90;
  ARTKey key;
  ArenaAllocator arena_allocator;
  
  allocator = Allocator::Get((art->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&arena_allocator,allocator,0x800);
  uVar1 = (r_node->super_IndexPointer).data;
  data = (ulong *)ArenaAllocator::Allocate(&arena_allocator,8);
  *data = (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  *(data_t *)data = 0x80;
  ARTKey::ARTKey(&local_90,(data_ptr_t)data,8);
  key.len = local_90.len;
  key.data = local_90.data;
  ART::Insert(art,l_node,&key,0,&key,(GateStatus)((l_node->super_IndexPointer).data >> 0x3f),
              (optional_ptr<duckdb::ART,_true>)0x0,DEFAULT);
  (r_node->super_IndexPointer).data = 0;
  ArenaAllocator::~ArenaAllocator(&arena_allocator);
  return;
}

Assistant:

void Leaf::MergeInlined(ART &art, Node &l_node, Node &r_node) {
	D_ASSERT(r_node.GetType() == INLINED);

	ArenaAllocator arena_allocator(Allocator::Get(art.db));
	auto key = ARTKey::CreateARTKey<row_t>(arena_allocator, r_node.GetRowId());
	art.Insert(l_node, key, 0, key, l_node.GetGateStatus(), nullptr, IndexAppendMode::DEFAULT);
	r_node.Clear();
}